

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlineBlocks.cpp
# Opt level: O2

void inlineBlocks(Module *module,Program *program)

{
  pointer ppEVar1;
  Func *this;
  Expr *pEVar2;
  Module *pMVar3;
  Expr **expr;
  pointer ppEVar4;
  BasicBlock *block;
  Module *f;
  Function *pFVar5;
  InliningVisitor iv;
  
  for (pMVar3 = module + 0x20; pMVar3 = *(Module **)pMVar3, pMVar3 != module + 0x18;
      pMVar3 = pMVar3 + 8) {
    f = pMVar3 + -0x38;
    if (pMVar3 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    this = Program::getFunction(program,(Function *)f);
    for (pFVar5 = (Function *)f + 0x50; pFVar5 = *(Function **)pFVar5,
        pFVar5 != (Function *)f + 0x48; pFVar5 = pFVar5 + 8) {
      block = (BasicBlock *)(pFVar5 + -0x18);
      if (pFVar5 == (Function *)0x0) {
        block = (BasicBlock *)0x0;
      }
      iv.container = Func::createBlockIfNotExist(this,block);
      iv.super_SimplifyingExprVisitor.super_ExprVisitor._vptr_ExprVisitor =
           (ExprVisitor)&PTR_visit_00198520;
      ppEVar1 = ((iv.container)->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppEVar4 = ((iv.container)->expressions).
                     super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppEVar4 != ppEVar1; ppEVar4 = ppEVar4 + 1) {
        (*(*ppEVar4)->_vptr_Expr[2])(*ppEVar4,&iv);
        pEVar2 = InliningVisitor::simplify(&iv,*ppEVar4);
        *ppEVar4 = pEVar2;
      }
    }
  }
  Program::addPass(program,InlineBlocks);
  return;
}

Assistant:

void inlineBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::IdentifyInlinableBlocks));


    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            InliningVisitor iv(myBlock);

            for (auto& expr : myBlock->expressions) {
                expr->accept(iv);
                expr = iv.simplify(expr);
            }
        }
    }

    program.addPass(PassType::InlineBlocks);
}